

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void * in_memory_snapshot_thread(void *args)

{
  int iVar1;
  fdb_status fVar2;
  undefined8 in_RDI;
  int i;
  char value [256];
  char key [256];
  fdb_doc *doc;
  fdb_status status;
  fdb_iterator *fit;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffd6c;
  uint local_28c;
  fdb_iterator *in_stack_fffffffffffffd78;
  fdb_doc **in_stack_fffffffffffffde0;
  fdb_iterator *in_stack_fffffffffffffde8;
  char local_188 [264];
  size_t *local_80;
  fdb_status local_74;
  fdb_iterator *local_70;
  fdb_kvs_handle *local_68;
  undefined8 local_60;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  undefined8 local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  local_60 = local_8;
  local_74 = fdb_snapshot_open((fdb_kvs_handle *)value._16_8_,(fdb_kvs_handle **)value._8_8_,
                               value._0_8_);
  if (local_74 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    in_memory_snapshot_thread::__test_pass = 0;
    if (local_74 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdb6,"void *in_memory_snapshot_thread(void *)");
    }
  }
  uVar3 = 0;
  uVar4 = 0;
  local_74 = fdb_iterator_init(local_68,&local_70,(void *)0x0,0,(void *)0x0,0,0);
  if (local_74 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    in_memory_snapshot_thread::__test_pass = 0;
    if (local_74 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdba,"void *in_memory_snapshot_thread(void *)");
    }
  }
  local_28c = 0;
  do {
    local_80 = (size_t *)0x0;
    local_74 = fdb_iterator_get(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    if (local_74 != FDB_RESULT_SUCCESS) break;
    sprintf(local_188,"key%d",(ulong)local_28c);
    sprintf(&stack0xfffffffffffffd78,"body%d",(ulong)local_28c);
    iVar1 = memcmp((void *)local_80[4],local_188,*local_80);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_188,local_80[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      in_memory_snapshot_thread::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    iVar1 = memcmp((void *)local_80[8],&stack0xfffffffffffffd78,local_80[2]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&stack0xfffffffffffffd78,
              local_80[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      in_memory_snapshot_thread::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    local_28c = local_28c + 1;
    fdb_doc_free((fdb_doc *)0x119449);
    fVar2 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffd6c,CONCAT22(uVar4,uVar3)));
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (local_28c != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    in_memory_snapshot_thread::__test_pass = 0;
    if (local_28c != 10) {
      __assert_fail("i == 10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc9,"void *in_memory_snapshot_thread(void *)");
    }
  }
  local_74 = fdb_iterator_close(in_stack_fffffffffffffd78);
  if (local_74 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    in_memory_snapshot_thread::__test_pass = 0;
    if (local_74 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdcc,"void *in_memory_snapshot_thread(void *)");
    }
  }
  local_74 = fdb_kvs_close((fdb_kvs_handle *)
                           CONCAT44(in_stack_fffffffffffffd6c,CONCAT22(uVar4,uVar3)));
  if (local_74 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    in_memory_snapshot_thread::__test_pass = 0;
    if (local_74 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdce,"void *in_memory_snapshot_thread(void *)");
    }
  }
  pthread_exit((void *)0x0);
}

Assistant:

void *in_memory_snapshot_thread(void *args)
{

    TEST_INIT();

    fdb_kvs_handle *db = (fdb_kvs_handle *)args;
    fdb_kvs_handle *snap_db;
    fdb_iterator *fit;
    fdb_status status;
    fdb_doc *doc;
    char key[256], value[256];

    // Open in-memory snapshot
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Iterate the in-memory snapshot
    status = fdb_iterator_init(snap_db, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    int i = 0;
    do {
        doc = NULL;
        status = fdb_iterator_get(fit, &doc);
        if (status != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        i++;
        fdb_doc_free(doc);
    } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    TEST_CHK(i == 10);

    status = fdb_iterator_close(fit);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(snap_db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // shutdown
    thread_exit(0);
    return NULL;
}